

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int luaB_opentests(lua_State *L)

{
  lua_Alloc p_Var1;
  void *ud;
  Memcontrol *local_10;
  
  lua_atpanic(L,tpanic);
  atexit(checkfinalmem);
  p_Var1 = lua_getallocf(L,&local_10);
  if (p_Var1 != debug_realloc) {
    __assert_fail("lua_getallocf(L, &ud) == debug_realloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x6c4,"int luaB_opentests(lua_State *)");
  }
  if (local_10 == &l_memcontrol) {
    p_Var1 = lua_getallocf(L,(void **)0x0);
    lua_setallocf(L,p_Var1,local_10);
    luaL_checkversion_(L,503.0,0x88);
    lua_createtable(L,0,0x25);
    luaL_setfuncs(L,tests_funcs,0);
    return 1;
  }
  __assert_fail("ud == ((void *)(&l_memcontrol))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x6c6,"int luaB_opentests(lua_State *)");
}

Assistant:

int luaB_opentests (lua_State *L) {
  void *ud;
  lua_atpanic(L, &tpanic);
  atexit(checkfinalmem);
#if _WIN32
  lua_getallocf(L, &ud);
#else
  lua_assert(lua_getallocf(L, &ud) == debug_realloc);
#endif
  lua_assert(ud == cast(void *, &l_memcontrol));
  lua_setallocf(L, lua_getallocf(L, NULL), ud);
  luaL_newlib(L, tests_funcs);
  return 1;
}